

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.h
# Opt level: O0

bool __thiscall x86Argument::operator==(x86Argument *this,x86Argument *r)

{
  x86Argument *r_local;
  x86Argument *this_local;
  
  if ((this->type == r->type) && ((this->field_1).reg == (r->field_1).reg)) {
    if ((((this->field_1).reg == (r->field_1).reg) &&
        (((this->ptrBase == r->ptrBase && (this->ptrIndex == r->ptrIndex)) &&
         (this->ptrMult == r->ptrMult)))) && (this->ptrNum == r->ptrNum)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const x86Argument& r)
	{
		if(type != r.type || reg != r.reg)
			return false;

		if(ptrSize != r.ptrSize || ptrBase != r.ptrBase || ptrIndex != r.ptrIndex || ptrMult != r.ptrMult || ptrNum != r.ptrNum)
			return false;

		return true;
	}